

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

size_t __thiscall pybind11::sequence::size(sequence *this)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  ssize_t result;
  error_already_set *in_stack_00000040;
  
  sVar1 = PySequence_Size(*in_RDI);
  if (sVar1 == 0xffffffffffffffff) {
    uVar2 = __cxa_allocate_exception(0x28);
    error_already_set::error_already_set(in_stack_00000040);
    __cxa_throw(uVar2,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return sVar1;
}

Assistant:

size_t size() const {
        ssize_t result = PySequence_Size(m_ptr);
        if (result == -1)
            throw error_already_set();
        return (size_t) result;
    }